

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

bool commandLineSolverOk(HighsLogOptions *report_log_options,string *value)

{
  __type _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  HighsLogOptions *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  _Var1 = std::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if ((((!_Var1) &&
       (_Var1 = std::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8), !_Var1)) &&
      (_Var1 = std::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8), !_Var1)) &&
     (_Var1 = std::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8), !_Var1)) {
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::c_str();
    uVar4 = std::__cxx11::string::c_str();
    uVar5 = std::__cxx11::string::c_str();
    uVar6 = std::__cxx11::string::c_str();
    highsLogUser(in_RDI,kWarning,
                 "Value \"%s\" for solver option is not one of \"%s\", \"%s\", \"%s\" or \"%s\"\n",
                 uVar2,uVar3,uVar4,uVar5,uVar6);
    return false;
  }
  return true;
}

Assistant:

bool commandLineSolverOk(const HighsLogOptions& report_log_options,
                         const string& value) {
  if (value == kSimplexString || value == kHighsChooseString ||
      value == kIpmString || value == kPdlpString)
    return true;
  highsLogUser(report_log_options, HighsLogType::kWarning,
               "Value \"%s\" for solver option is not one of \"%s\", \"%s\", "
               "\"%s\" or \"%s\"\n",
               value.c_str(), kSimplexString.c_str(),
               kHighsChooseString.c_str(), kIpmString.c_str(),
               kPdlpString.c_str());
  return false;
}